

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

value * mjs::to_primitive(value *__return_storage_ptr__,value *v,value_type hint)

{
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  bool bVar4;
  bool bVar5;
  object_ptr o;
  value fo;
  gc_heap_ptr_untyped local_88;
  vector<mjs::value,_std::allocator<mjs::value>_> local_78;
  value *local_60;
  value local_58;
  
  if (v->type_ == object) {
    local_88.heap_ =
         (v->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    local_88.pos_ = *(uint32_t *)((long)&v->field_1 + 8);
    if (local_88.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_88.heap_,&local_88);
    }
    if (hint == undefined) {
      plVar2 = (long *)gc_heap_ptr_untyped::get(&local_88);
      hint = (**(code **)(*plVar2 + 0x18))(plVar2);
    }
    local_60 = v;
    if (1 < hint - number) {
      __assert_fail("hint == value_type::number || hint == value_type::string",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                    ,0x7c,"value mjs::to_primitive(const value &, value_type)");
    }
    bVar5 = false;
    bVar4 = true;
    while( true ) {
      puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(&local_88);
      bVar5 = bVar5 != (hint == string);
      local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x1a2708;
      if (!bVar5) {
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x1a4264;
      }
      local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((ulong)bVar5 + 7);
      (**(code **)*puVar3)(&local_58,puVar3,&local_78);
      bVar5 = true;
      if (local_58.type_ == object) {
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        call_function(__return_storage_ptr__,&local_58,local_60,&local_78);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_78);
        if (__return_storage_ptr__->type_ < object) {
          bVar5 = false;
        }
        else {
          value::destroy(__return_storage_ptr__);
        }
      }
      value::destroy(&local_58);
      if (!bVar5) break;
      bVar5 = true;
      bVar1 = !bVar4;
      bVar4 = false;
      if (bVar1) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__exception_001da600;
        __cxa_throw(puVar3,&to_primitive_failed_error::typeinfo,std::exception::~exception);
      }
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
  }
  else {
    __return_storage_ptr__->type_ = undefined;
    value::operator=(__return_storage_ptr__,v);
  }
  return __return_storage_ptr__;
}

Assistant:

value to_primitive(const value& v, value_type hint) {
    if (v.type() != value_type::object) {
        return v;
    }

    auto o = v.object_value();

    // [[DefaultValue]] (Hint)
    if (hint == value_type::undefined) {
        // When hint is undefined, assume Number unless it's a Date object in which case assume String
        hint = o->default_value_type();
    }

    assert(hint == value_type::number || hint == value_type::string);
    for (int i = 0; i < 2; ++i) {
        const wchar_t* const id = (hint == value_type::string) ^ i ? L"toString" : L"valueOf";
        const auto fo = o->get(id);
        if (fo.type() != value_type::object) {
            continue;
        }
        auto res = call_function(fo, v, {});
        if (!is_primitive(res.type())) {
            continue;
        }
        return res;
    }

    throw to_primitive_failed_error{};
}